

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

uint8 get_marker(jpeg *j)

{
  uint8 uVar1;
  uint8 uVar2;
  int iVar3;
  
  uVar2 = j->marker;
  if (uVar2 == 0xff) {
    iVar3 = get8(&j->s);
    uVar2 = 0xff;
    uVar1 = (uint8)iVar3;
    while (uVar1 == 0xff) {
      iVar3 = get8(&j->s);
      uVar2 = (uint8)iVar3;
      uVar1 = uVar2;
    }
  }
  else {
    j->marker = 0xff;
  }
  return uVar2;
}

Assistant:

static uint8 get_marker(jpeg *j)
{
   uint8 x;
   if (j->marker != MARKER_none) { x = j->marker; j->marker = MARKER_none; return x; }
   x = get8u(&j->s);
   if (x != 0xff) return MARKER_none;
   while (x == 0xff)
      x = get8u(&j->s);
   return x;
}